

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

Token * MyCompiler::nextToken(Token *__return_storage_ptr__,istream *stream)

{
  char *__bkt;
  SymbolType SVar1;
  __node_base _Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  Token *pTVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var13;
  __node_ptr p_Var14;
  __node_base _Var15;
  __buckets_ptr pp_Var16;
  __node_base_ptr p_Var17;
  LexicalError *this;
  long lVar18;
  _Hash_node_base *p_Var19;
  _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  ulong uVar20;
  ulong uVar21;
  key_type *__k;
  undefined4 *puVar22;
  size_type sVar23;
  string *psVar24;
  size_type sVar25;
  byte bVar26;
  pos_type offset;
  undefined1 auVar27 [16];
  char c;
  undefined3 uStack_3ab;
  Token *local_3a8;
  undefined1 local_39b;
  undefined1 local_39a;
  undefined1 local_399;
  long local_398;
  SymbolType local_390;
  float local_38c;
  ulong local_388;
  SymbolType local_380 [10];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string buffer;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_58;
  
  bVar26 = 0;
  local_3a8 = __return_storage_ptr__;
  if ((nextToken(std::istream&)::keywordsMap_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&nextToken(std::istream&)::keywordsMap_abi_cxx11_), iVar7 != 0)) {
    _c = BEGIN;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
                *)&buffer,(char (*) [6])"begin",(SymbolType *)&c);
    local_38c = 2.8026e-44;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_210,(char (*) [4])"end",(SymbolType *)&local_38c);
    local_390 = IF;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_1e8,(char (*) [3])"if",&local_390);
    local_380[9] = 0x16;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_1c0,(char (*) [5])"then",local_380 + 9);
    local_380[8] = 0x17;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_198,(char (*) [6])"while",local_380 + 8);
    local_380[7] = 0x18;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_170,(char (*) [6])"write",local_380 + 7);
    local_380[6] = 0x19;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_148,(char (*) [5])"read",local_380 + 6);
    local_380[5] = 0x1a;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_120,(char (*) [3])"do",local_380 + 5);
    local_380[4] = 0x1b;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_f8,(char (*) [5])"call",local_380 + 4);
    local_380[3] = 0x1c;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_d0,(char (*) [6])"const",local_380 + 3);
    local_380[2] = 0x1d;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_a8,(char (*) [4])"var",local_380 + 2);
    local_380[1] = 0x1e;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[10],_MyCompiler::SymbolType,_true>
              (&local_80,(char (*) [10])"procedure",local_380 + 1);
    local_380[0] = ODD;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>(&local_58,(char (*) [4])"odd",local_380)
    ;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&buffer,&stack0xffffffffffffffd0
               ,0,&local_399,&local_39a,&local_39b);
    lVar18 = 0x1e0;
    do {
      std::__cxx11::string::~string((string *)((long)&buffer._M_dataplus._M_p + lVar18));
      lVar18 = lVar18 + -0x28;
    } while (lVar18 != -0x28);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::keywordsMap_abi_cxx11_);
  }
  if ((nextToken(std::istream&)::startCharsSymbolTypeMap == '\0') &&
     (iVar7 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsSymbolTypeMap), iVar7 != 0))
  {
    puVar22 = &DAT_00105084;
    psVar24 = &buffer;
    for (lVar18 = 0x16; lVar18 != 0; lVar18 = lVar18 + -1) {
      *(undefined4 *)&(psVar24->_M_dataplus)._M_p = *puVar22;
      puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
      psVar24 = (string *)((long)psVar24 + (ulong)bVar26 * -8 + 4);
    }
    std::
    _Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<char_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&nextToken::startCharsSymbolTypeMap,&buffer,&local_1e8.first._M_string_length,0,&c
               ,&local_38c,&local_390);
    __cxa_atexit(std::
                 unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken::startCharsSymbolTypeMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsSymbolTypeMap);
  }
  if ((nextToken(std::istream&)::startCharsStateMap == '\0') &&
     (iVar7 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsStateMap), iVar7 != 0)) {
    nextToken::startCharsStateMap._M_h._M_buckets =
         &nextToken::startCharsStateMap._M_h._M_single_bucket;
    nextToken::startCharsStateMap._M_h._M_bucket_count = 1;
    nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    nextToken::startCharsStateMap._M_h._M_element_count = 0;
    nextToken::startCharsStateMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    nextToken::startCharsStateMap._M_h._M_rehash_policy._M_next_resize = 0;
    nextToken::startCharsStateMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    sVar23 = 0;
    p_Var13 = (_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)std::__detail::_Prime_rehash_policy::_M_next_bkt(0x108270);
    if (nextToken::startCharsStateMap._M_h._M_bucket_count < p_Var13) {
      nextToken::startCharsStateMap._M_h._M_buckets =
           std::
           _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_allocate_buckets(p_Var13,sVar23);
      nextToken::startCharsStateMap._M_h._M_bucket_count = (size_type)p_Var13;
    }
    for (local_398 = 0; local_398 != 0x18; local_398 = local_398 + 8) {
      __bkt = &DAT_001050dc + local_398;
      local_388 = (ulong)*__bkt;
      p_Var13 = (_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_388 % nextToken::startCharsStateMap._M_h._M_bucket_count);
      p_Var14 = std::
                _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_node(p_Var13,(size_type)__bkt,(key_type *)p_Var13,0x1050dc);
      if (p_Var14 == (__node_ptr)0x0) {
        _Var15._M_nxt = (_Hash_node_base *)operator_new(0x10);
        (_Var15._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
        _Var15._M_nxt[1]._M_nxt = *(_Hash_node_base **)__bkt;
        buffer._M_dataplus._M_p = (pointer)&nextToken::startCharsStateMap;
        sVar23 = nextToken::startCharsStateMap._M_h._M_bucket_count;
        buffer._M_string_length = (size_type)_Var15._M_nxt;
        auVar27 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            (0x108270,nextToken::startCharsStateMap._M_h._M_bucket_count,
                             nextToken::startCharsStateMap._M_h._M_element_count);
        this_00 = auVar27._8_8_;
        if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pp_Var16 = std::
                     _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::_M_allocate_buckets(this_00,sVar23);
          _Var2 = nextToken::startCharsStateMap._M_h._M_before_begin;
          nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          uVar21 = 0;
LAB_00103961:
          uVar20 = uVar21;
          p_Var19 = _Var2._M_nxt;
          if (p_Var19 != (_Hash_node_base *)0x0) {
            _Var2._M_nxt = p_Var19->_M_nxt;
            uVar21 = (ulong)(long)*(char *)&p_Var19[1]._M_nxt % (ulong)this_00;
            if (pp_Var16[uVar21] == (__node_base_ptr)0x0) goto LAB_00103991;
            p_Var19->_M_nxt = pp_Var16[uVar21]->_M_nxt;
            p_Var17 = pp_Var16[uVar21];
            uVar21 = uVar20;
            goto LAB_001039b7;
          }
          std::
          _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_deallocate_buckets(&nextToken::startCharsStateMap._M_h);
          p_Var13 = (_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(local_388 % (ulong)this_00);
          nextToken::startCharsStateMap._M_h._M_buckets = pp_Var16;
          nextToken::startCharsStateMap._M_h._M_bucket_count = (size_type)this_00;
        }
        pp_Var16 = nextToken::startCharsStateMap._M_h._M_buckets;
        if (nextToken::startCharsStateMap._M_h._M_buckets[(long)p_Var13] == (__node_base_ptr)0x0) {
          (_Var15._M_nxt)->_M_nxt = nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt;
          if (nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            p_Var19 = nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt + 1;
            nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt = _Var15._M_nxt;
            pp_Var16[(ulong)(long)*(char *)&p_Var19->_M_nxt %
                     nextToken::startCharsStateMap._M_h._M_bucket_count] = _Var15._M_nxt;
            pp_Var16 = nextToken::startCharsStateMap._M_h._M_buckets;
            _Var15._M_nxt = nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt;
          }
          nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt = _Var15._M_nxt;
          pp_Var16[(long)p_Var13] = &nextToken::startCharsStateMap._M_h._M_before_begin;
        }
        else {
          (_Var15._M_nxt)->_M_nxt =
               nextToken::startCharsStateMap._M_h._M_buckets[(long)p_Var13]->_M_nxt;
          pp_Var16[(long)p_Var13]->_M_nxt = _Var15._M_nxt;
        }
        nextToken::startCharsStateMap._M_h._M_element_count =
             nextToken::startCharsStateMap._M_h._M_element_count + 1;
        buffer._M_string_length = 0;
        std::
        _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_Scoped_node::~_Scoped_node((_Scoped_node *)&buffer);
      }
    }
    __cxa_atexit(std::
                 unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                 ::~unordered_map,&nextToken::startCharsStateMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsStateMap);
  }
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  iVar7 = 0;
  do {
    if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) {
LAB_00103359:
      if (iVar7 - 1U < 5) {
        pTVar10 = (Token *)(*(code *)((long)&DAT_00105070 + (long)(int)(&DAT_00105070)[iVar7 - 1U]))
                                     ();
        return pTVar10;
      }
LAB_0010342c:
      Token::Token(local_3a8,NUL);
LAB_00103538:
      std::__cxx11::string::~string((string *)&buffer);
      return local_3a8;
    }
    cVar6 = (char)&buffer;
    switch(iVar7) {
    case 0:
      std::ws<char,std::char_traits<char>>(stream);
      if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) goto LAB_0010342c;
      cVar5 = std::istream::peek();
      _c = CONCAT31(uStack_3ab,cVar5);
      iVar7 = isalpha((int)cVar5);
      if (iVar7 == 0) {
        if (9 < (int)cVar5 - 0x30U) {
          __k = &c;
          cVar8 = std::
                  _Hashtable<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&nextToken::startCharsSymbolTypeMap._M_h,__k);
          if (cVar8.super__Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false>.
              _M_cur != (__node_type *)0x0) {
            std::istream::get();
            pmVar12 = std::__detail::
                      _Map_base<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&nextToken::startCharsSymbolTypeMap,&c);
            SVar1 = *pmVar12;
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_358,'\x01');
            Token::Token(local_3a8,SVar1,&local_358);
            psVar24 = &local_358;
            goto LAB_00103533;
          }
          cVar9 = std::
                  _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&c,__k);
          if (cVar9.super__Node_iterator_base<std::pair<const_char,_State>,_false>._M_cur !=
              (__node_type *)0x0) {
            std::istream::get();
            cVar9 = std::
                    _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&c,__k);
            if (cVar9.super__Node_iterator_base<std::pair<const_char,_State>,_false>._M_cur !=
                (__node_type *)0x0) {
              iVar7 = *(int *)((long)cVar9.
                                     super__Node_iterator_base<std::pair<const_char,_State>,_false>.
                                     _M_cur + 0xc);
              break;
            }
            std::__throw_out_of_range("_Map_base::at");
          }
          this = (LexicalError *)__cxa_allocate_exception(0x20);
          auVar27 = std::istream::tellg();
          offset._M_state = auVar27._8_8_;
          offset._M_off = auVar27._0_8_ + 1;
          LexicalError::LexicalError(this,offset);
          __cxa_throw(this,&LexicalError::typeinfo,std::runtime_error::~runtime_error);
        }
        std::istream::get();
        std::__cxx11::string::push_back(cVar6);
        iVar7 = 2;
      }
      else {
        std::istream::get();
        std::__cxx11::string::push_back(cVar6);
        iVar7 = 1;
      }
      break;
    case 1:
      cVar5 = std::istream::peek();
      iVar7 = isalnum((int)cVar5);
      sVar4 = buffer._M_string_length;
      _Var3 = buffer._M_dataplus;
      if (iVar7 == 0) {
        for (sVar25 = 0; sVar4 != sVar25; sVar25 = sVar25 + 1) {
          iVar7 = tolower((int)_Var3._M_p[sVar25]);
          _Var3._M_p[sVar25] = (char)iVar7;
        }
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&nextToken(std::istream&)::keywordsMap_abi_cxx11_._M_h,&buffer);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__cxx11::string::string((string *)&local_2d8,(string *)&buffer);
          Token::Token(local_3a8,IDENT,&local_2d8);
          psVar24 = &local_2d8;
        }
        else {
          SVar1 = *(SymbolType *)
                   ((long)cVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
                          ._M_cur + 0x28);
          std::__cxx11::string::string((string *)&local_2b8,(string *)&buffer);
          Token::Token(local_3a8,SVar1,&local_2b8);
          psVar24 = &local_2b8;
        }
LAB_00103533:
        std::__cxx11::string::~string((string *)psVar24);
        goto LAB_00103538;
      }
      std::istream::get();
      std::__cxx11::string::push_back(cVar6);
      iVar7 = 1;
      break;
    case 2:
      cVar5 = std::istream::peek();
      if (9 < (int)cVar5 - 0x30U) {
        std::__cxx11::string::string((string *)&local_2f8,(string *)&buffer);
        Token::Token(local_3a8,NUMBER,&local_2f8);
        psVar24 = &local_2f8;
        goto LAB_00103533;
      }
      std::istream::get();
      std::__cxx11::string::push_back(cVar6);
      iVar7 = 2;
      break;
    case 3:
      cVar6 = std::istream::peek();
      if (cVar6 == '=') {
        std::istream::get();
        std::__cxx11::string::string((string *)&local_258,"<=",(allocator *)&c);
        Token::Token(local_3a8,LEQ,&local_258);
        psVar24 = &local_258;
      }
      else {
        std::__cxx11::string::string((string *)&local_318,"<",(allocator *)&c);
        Token::Token(local_3a8,LSS,&local_318);
        psVar24 = &local_318;
      }
      goto LAB_00103533;
    case 4:
      cVar6 = std::istream::peek();
      if (cVar6 == '=') {
        std::istream::get();
        std::__cxx11::string::string((string *)&local_278,">=",(allocator *)&c);
        Token::Token(local_3a8,GEQ,&local_278);
        psVar24 = &local_278;
      }
      else {
        std::__cxx11::string::string((string *)&local_338,">",(allocator *)&c);
        Token::Token(local_3a8,GTR,&local_338);
        psVar24 = &local_338;
      }
      goto LAB_00103533;
    default:
      cVar6 = std::istream::peek();
      if (cVar6 == '=') {
        std::istream::get();
        std::__cxx11::string::string((string *)&local_298,":=",(allocator *)&c);
        Token::Token(local_3a8,BECOMES,&local_298);
        psVar24 = &local_298;
        goto LAB_00103533;
      }
      goto LAB_00103359;
    }
  } while( true );
LAB_00103991:
  p_Var19->_M_nxt = nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt;
  nextToken::startCharsStateMap._M_h._M_before_begin._M_nxt = p_Var19;
  pp_Var16[uVar21] = &nextToken::startCharsStateMap._M_h._M_before_begin;
  if (p_Var19->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var17 = (__node_base_ptr)(pp_Var16 + uVar20);
LAB_001039b7:
    p_Var17->_M_nxt = p_Var19;
  }
  goto LAB_00103961;
}

Assistant:

MyCompiler::Token MyCompiler::nextToken(std::istream &stream)
{
    enum class State
    {
        START, WORD, NUM, LT, GT, COLON
    };
    static const std::unordered_map<std::string, SymbolType> keywordsMap = {
            {"begin",     SymbolType::BEGIN},
            {"end",       SymbolType::END},
            {"if",        SymbolType::IF},
            {"then",      SymbolType::THEN},
            {"while",     SymbolType::WHILE},
            {"write",     SymbolType::WRITE},
            {"read",      SymbolType::READ},
            {"do",        SymbolType::DO},
            {"call",      SymbolType::CALL},
            {"const",     SymbolType::CONST},
            {"var",       SymbolType::VAR},
            {"procedure", SymbolType::PROC},
            {"odd",       SymbolType::ODD}
    };
    static const std::unordered_map<char, SymbolType> startCharsSymbolTypeMap = {
            {'+', SymbolType::PLUS},
            {'-', SymbolType::MINUS},
            {'*', SymbolType::TIMES},
            {'/', SymbolType::SLASH},
            {'=', SymbolType::EQL},
            {'#', SymbolType::NEQ},
            {'(', SymbolType::LPAREN},
            {')', SymbolType::RPAREN},
            {',', SymbolType::COMMA},
            {';', SymbolType::SEMICOLON},
            {'.', SymbolType::PERIOD}
    };
    static const std::unordered_map<char, State> startCharsStateMap = {
            {'<', State::LT},
            {'>', State::GT},
            {':', State::COLON}
    };

    std::string buffer;
    State state = State::START;
    while (stream.good())
    {
        if (state == State::START)
        {
            std::ws(stream);
            if (!stream.good())
                break;
            char c = stream.peek();
            if (std::isalpha(c))
            {
                buffer.push_back(stream.get());
                state = State::WORD;
            }
            else if (std::isdigit(c))
            {
                buffer.push_back(stream.get());
                state = State::NUM;
            }
            else if (startCharsSymbolTypeMap.find(c) != startCharsSymbolTypeMap.end())
            {
                stream.get();
                return Token(startCharsSymbolTypeMap.at(c), std::string(1, c));
            }
            else if (startCharsStateMap.find(c) != startCharsStateMap.end())
            {
                stream.get();
                state = startCharsStateMap.at(c);
            }
            else
                throw LexicalError(stream.tellg() + std::ios::pos_type(1));
        }
        else if (state == State::WORD)
        {
            char c = stream.peek();
            if (std::isalnum(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::NUM)
        {
            char c = stream.peek();
            if (std::isdigit(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::LT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::LEQ, "<=");
            }
            else
                break;
        }
        else if (state == State::GT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::GEQ, ">=");
            }
            else
                break;
        }
        else // if (state == State::COLON)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::BECOMES, ":=");
            }
            else
                break;
        }
    }
    if (state == State::WORD)
    {
        std::transform(buffer.begin(), buffer.end(), buffer.begin(), ::tolower);
        auto search = keywordsMap.find(buffer);
        if (search != keywordsMap.end())
            return Token(search->second, buffer);
        else
            return Token(SymbolType::IDENT, buffer);
    }
    else if (state == State::NUM)
        return Token(SymbolType::NUMBER, buffer);
    else if (state == State::LT)
        return Token(SymbolType::LSS, "<");
    else if (state == State::GT)
        return Token(SymbolType::GTR, ">");
    else if (state == State::COLON)
        throw LexicalError(stream.tellg());
    else
        return Token(SymbolType::NUL);
}